

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

int json_object_object_get_ex(json_object *jso,char *key,json_object **value)

{
  json_object_object *pjVar1;
  json_object **value_local;
  char *key_local;
  json_object *jso_local;
  
  if (value != (json_object **)0x0) {
    *value = (json_object *)0x0;
  }
  if (jso == (json_object *)0x0) {
    jso_local._4_4_ = 0;
  }
  else if (jso->o_type == json_type_object) {
    pjVar1 = JC_OBJECT_C(jso);
    jso_local._4_4_ = lh_table_lookup_ex(pjVar1->c_object,key,value);
  }
  else {
    if (value != (json_object **)0x0) {
      *value = (json_object *)0x0;
    }
    jso_local._4_4_ = 0;
  }
  return jso_local._4_4_;
}

Assistant:

json_bool json_object_object_get_ex(const struct json_object *jso, const char *key,
                                    struct json_object **value)
{
	if (value != NULL)
		*value = NULL;

	if (NULL == jso)
		return 0;

	switch (jso->o_type)
	{
	case json_type_object:
		return lh_table_lookup_ex(JC_OBJECT_C(jso)->c_object, (const void *)key,
		                          (void **)value);
	default:
		if (value != NULL)
			*value = NULL;
		return 0;
	}
}